

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O1

void TrackUsedInit(Disk *disk)

{
  uint *puVar1;
  pointer puVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  int iVar6;
  Data *pDVar7;
  exception *peVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  long lVar13;
  long lVar14;
  Sector *sector;
  MGT_DISK_INFO di;
  uint8_t abBAM [195];
  byte local_142;
  byte local_141;
  Sector *local_140;
  MGT_DISK_INFO local_138;
  Header local_108;
  byte local_f8 [200];
  
  memset(local_f8,0,0xc3);
  adwUsed[0][2] = 0;
  adwUsed[1][0] = 0;
  adwUsed[1][1] = 0;
  adwUsed[1][2] = 0;
  adwUsed[0][0] = 0x11;
  adwUsed[0][1] = 0;
  local_140 = (Sector *)0x0;
  Header::Header((Header *)&local_138,0,0,1,2);
  bVar4 = Disk::find(disk,(Header *)&local_138,&local_140);
  if ((!bVar4) || (iVar6 = Sector::data_size(local_140), iVar6 < 0x200)) {
    peVar8 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[23]>(peVar8,(char (*) [23])"disk is not MGT format");
    __cxa_throw(peVar8,&util::exception::typeinfo,std::runtime_error::~runtime_error);
  }
  local_138.disk_label._M_dataplus._M_p = (pointer)&local_138.disk_label.field_2;
  local_138.dos_type = SAMDOS;
  local_138.dir_tracks = 4;
  local_138.disk_label._M_string_length = 0;
  local_138.disk_label.field_2._M_local_buf[0] = '\0';
  local_138.serial_number = 0;
  pDVar7 = Sector::data_copy(local_140,0);
  GetDiskInfo((pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start,&local_138);
  local_142 = 0;
  if (0 < local_138.dir_tracks) {
    bVar4 = false;
    do {
      local_141 = 1;
      if (!bVar4) {
        do {
          if (local_141 != 1 || local_142 != 4) {
            if ((char)local_142 < '\0') {
              __assert_fail("cyl >= 0 && cyl < MAX_DISK_CYLS",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/include/Header.h"
                            ,0x29,"CylHead::CylHead(int, int)");
            }
            Header::Header(&local_108,(uint)local_142,0,(uint)local_141,2);
            bVar5 = Disk::find(disk,&local_108,&local_140);
            if ((!bVar5) || (iVar6 = Sector::data_size(local_140), iVar6 < 0x200)) {
              peVar8 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::
              exception<char_const(&)[5],unsigned_char&,char_const(&)[16],unsigned_char&,char_const(&)[11]>
                        (peVar8,(char (*) [5])"cyl ",&local_142,(char (*) [16])" head 0 sector ",
                         &local_141,(char (*) [11])0x1b075a);
              __cxa_throw(peVar8,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            if (!bVar4) {
              lVar13 = 0xf;
              lVar14 = 0;
              do {
                pDVar7 = Sector::data_copy(local_140,0);
                puVar2 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((puVar2[lVar14 * 0x100] & 0x3f) == 0) {
                  bVar4 = puVar2[lVar14 * 0x100 + 1] == '\0';
                }
                else {
                  adwUsed[0][local_142 >> 5] = adwUsed[0][local_142 >> 5] | 1 << (local_142 & 0x1f);
                  if (((lVar14 == 1) && (local_141 == 9)) &&
                     (local_138.dir_tracks - 1U != (uint)local_142)) {
                    uVar9 = local_142 + 1;
                    adwUsed[0][uVar9 >> 5] = adwUsed[0][uVar9 >> 5] | 1 << ((byte)uVar9 & 0x1f);
                  }
                  lVar11 = 0;
                  do {
                    local_f8[lVar11] = local_f8[lVar11] | puVar2[lVar11 + lVar13];
                    lVar11 = lVar11 + 1;
                  } while (lVar11 != 0xc3);
                }
                if (bVar4) break;
                lVar13 = lVar13 + 0x100;
                bVar5 = lVar14 == 0;
                lVar14 = lVar14 + 1;
              } while (bVar5);
            }
          }
          local_141 = local_141 + 1;
        } while ((!bVar4) && (local_141 < 0xb));
      }
      local_142 = local_142 + 1;
    } while ((!bVar4) && ((int)(uint)local_142 < local_138.dir_tracks));
  }
  uVar12 = 0;
  do {
    if ((local_f8[uVar12 >> 3] >> ((uint)uVar12 & 7) & 1) != 0) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar12;
      uVar9 = (SUB164(auVar3 * ZEXT816(0xcccccccccccccccd),8) >> 3) + 4 & 0xff;
      uVar10 = uVar9 % 0x50;
      puVar1 = (uint *)((long)adwUsed[(ulong)uVar9 / 0x50] + (ulong)(uVar10 >> 3 & 0xc));
      *puVar1 = *puVar1 | 1 << ((byte)uVar10 & 0x1f);
    }
    uVar12 = uVar12 + 1;
  } while (uVar12 != 0x618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.disk_label._M_dataplus._M_p != &local_138.disk_label.field_2) {
    operator_delete(local_138.disk_label._M_dataplus._M_p,
                    CONCAT71(local_138.disk_label.field_2._M_allocated_capacity._1_7_,
                             local_138.disk_label.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TrackUsedInit(Disk& disk)
{
    bool fDone = false;
    uint8_t abBAM[195] = {};

    // Tracks 0 and 4 cover the (empty) directory start and boot sector, and are always used
    memset(&adwUsed, 0, sizeof(adwUsed));
    adwUsed[0][0] |= 0x00000011;

    const Sector* sector = nullptr;
    if (!disk.find(Header(0, 0, 1, 2), sector) || sector->data_size() < SECTOR_SIZE)
        throw util::exception("disk is not MGT format");

    MGT_DISK_INFO di;
    const Data& data1 = sector->data_copy();
    GetDiskInfo(data1.data(), di);

    for (uint8_t cyl = 0; !fDone && cyl < di.dir_tracks; ++cyl)
    {
        for (uint8_t sec = 1; !fDone && sec <= MGT_SECTORS; ++sec)
        {
            // Skip the boot sector on MasterDOS extended directories
            if (cyl == 4 && sec == 1)
                continue;

            CylHead cylhead(cyl, 0);
            if (!disk.find(Header(cyl, 0, sec, 2), sector) || sector->data_size() < SECTOR_SIZE)
                throw util::exception("cyl ", cyl, " head 0 sector ", sec, " not found");

            for (int entry = 0; !fDone && entry < 2; ++entry)
            {
                const Data& data = sector->data_copy();
                const MGT_DIR* pdi = reinterpret_cast<const MGT_DIR*>(data.data() + ((SECTOR_SIZE / 2) * entry));

                if (pdi->bType & 0x3f)
                {
                    // Mark the current track as used
                    adwUsed[0][cyl >> 5] |= (1 << (cyl & 0x1f));

                    // If the final entry of the non-final track is in use, ensure the next track is considered used
                    if (entry == 1 && sec == (MGT_SECTORS - 1) && cyl != (di.dir_tracks - 1))
                        adwUsed[0][(cyl + 1) >> 5] |= (1 << ((cyl + 1) & 0x1f));

                    // Merge the sector address map into the overall disk BAM
                    for (size_t i = 0; i < sizeof(abBAM); ++i)
                        abBAM[i] |= pdi->abSectorMap[i];
                }
                else
                    fDone = !pdi->abName[0];
            }
        }
    }

    // Convert the BAM used sectors to our used tracks
    for (size_t i = 0; i < (sizeof(abBAM) << 3); ++i)
    {
        // Sector in use?
        if (abBAM[i >> 3] & (1 << (i & 7)))
        {
            uint8_t cyl = static_cast<uint8_t>((i / MGT_SECTORS) + MGT_DIR_TRACKS);
            uint8_t head = cyl / NORMAL_TRACKS;

            cyl %= NORMAL_TRACKS;
            adwUsed[head][cyl >> 5] |= (1 << (cyl & 0x1f));
        }
    }
}